

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QStyleSheetBackgroundData>::detach_helper
          (QSharedDataPointer<QStyleSheetBackgroundData> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QStyleSheetBackgroundData *this_00;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QSharedDataPointer<QStyleSheetBackgroundData> *in_RDI;
  void *in_R8;
  QStyleSheetBackgroundData *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x464c1b);
  Qt::totally_ordered_wrapper<QStyleSheetBackgroundData_*>::get(&in_RDI->d);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x464c2d);
  if ((!bVar1) &&
     (this_00 = Qt::totally_ordered_wrapper<QStyleSheetBackgroundData_*>::get(&in_RDI->d),
     this_00 != (QStyleSheetBackgroundData *)0x0)) {
    QStyleSheetBackgroundData::~QStyleSheetBackgroundData(this_00);
    operator_delete(this_00,0x40);
  }
  Qt::totally_ordered_wrapper<QStyleSheetBackgroundData_*>::reset
            (&in_RDI->d,(QStyleSheetBackgroundData *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}